

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeCollapsePermMap(Abc_Obj_t *pNode,Abc_Obj_t *pSkip,Vec_Ptr_t *vFanins,int *pPerm)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  if (0 < vFanins->nSize) {
    lVar4 = 0;
    do {
      pPerm[lVar4] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFanins->nSize);
  }
  iVar6 = (pNode->vFanins).nSize;
  if (0 < iVar6) {
    piVar1 = (pNode->vFanins).pArray;
    ppvVar2 = pNode->pNtk->vObjs->pArray;
    uVar5 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)ppvVar2[piVar1[uVar5]];
      if (pAVar3 != pSkip) {
        if ((long)vFanins->nSize < 1) {
LAB_00862401:
          pPerm[uVar5 & 0xffffffff] = -1;
          return 0;
        }
        lVar4 = 0;
        while ((Abc_Obj_t *)vFanins->pArray[lVar4] != pAVar3) {
          lVar4 = lVar4 + 1;
          if (vFanins->nSize == lVar4) goto LAB_00862401;
        }
        pPerm[uVar5] = (int)lVar4;
        iVar6 = (pNode->vFanins).nSize;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)iVar6);
  }
  return 1;
}

Assistant:

int Abc_NodeCollapsePermMap( Abc_Obj_t * pNode, Abc_Obj_t * pSkip, Vec_Ptr_t * vFanins, int * pPerm )
{
    Abc_Obj_t * pFanin;
    int i;
    for ( i = 0; i < Vec_PtrSize(vFanins); i++ )
        pPerm[i] = i;
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( pFanin == pSkip )
            continue;
        pPerm[i] = Abc_ObjFaninNumberNew( vFanins, pFanin );
        if ( pPerm[i] == -1 )
            return 0;
    }
    return 1;
}